

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  long *plVar1;
  atomic<int> *paVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  BVH *pBVar11;
  MutexSys *pMVar12;
  Scene *pSVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  BuildRef *pBVar16;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  MutexSys *this_01;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  long lVar30;
  ulong uVar31;
  float *pfVar32;
  ulong uVar33;
  long lVar34;
  size_t sVar35;
  ulong uVar36;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar37 [16];
  undefined1 extraout_var [56];
  undefined1 auVar38 [64];
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  PrimRef *local_110;
  RefBuilderSmall *local_108;
  long *local_100;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  PrimInfo pinfo;
  
  sVar35 = this->objectID_;
  pGVar10 = (topBuilder->scene->geometries).items[sVar35].ptr;
  uVar6 = pGVar10->numPrimitives;
  uVar36 = CONCAT44(0,uVar6);
  lVar30 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_130._0_8_ = lVar30 + 0x550;
  if (lVar30 == 0) {
    local_130._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_110 = (PrimRef *)0x0;
  local_130[8] = false;
  local_120 = (undefined1  [16])0x0;
  local_108 = this;
  if (uVar36 != 0) {
    sVar35 = uVar36 << 5;
    (**((MemoryMonitorInterface *)local_130._0_8_)->_vptr_MemoryMonitorInterface)
              (local_130._0_8_,sVar35,0);
    if (uVar6 < 0xe0000) {
      local_110 = (PrimRef *)alignedMalloc(sVar35,0x20);
    }
    else {
      local_110 = (PrimRef *)os_malloc(sVar35,(bool *)(local_130 + 8));
    }
    local_120._8_4_ = uVar6;
    local_120._0_8_ = uVar36;
    local_120._12_4_ = 0;
    sVar35 = local_108->objectID_;
  }
  avx::createPrimRefArray
            (&pinfo,pGVar10,(uint)sVar35,uVar36,(mvector<PrimRef> *)local_130,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  local_100 = (long *)__tls_get_addr(&PTR_021f8d38);
  auVar38._8_56_ = extraout_var;
  auVar38._0_8_ = extraout_XMM0_Qa;
  uVar36 = 0;
  do {
    auVar37 = auVar38._0_16_;
    if (pinfo.end - pinfo.begin <= uVar36) {
      uVar27 = local_120._8_8_;
      if (local_110 != (PrimRef *)0x0) {
        if ((ulong)(local_120._8_8_ << 5) < 0x1c00000) {
          alignedFree(local_110);
        }
        else {
          os_free(local_110,local_120._8_8_ << 5,local_130[8]);
        }
      }
      if (uVar27 != 0) {
        (***(_func_int ***)local_130._0_8_)(local_130._0_8_,uVar27 * -0x20,1);
      }
      return;
    }
    pBVar11 = topBuilder->bvh;
    this_01 = (MutexSys *)*local_100;
    if (this_01 == (MutexSys *)0x0) {
      this_01 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_01);
      this_01[1].mutex = (void *)0x0;
      this_01[8].mutex = this_01;
      this_01[9].mutex = (void *)0x0;
      this_01[10].mutex = (void *)0x0;
      this_01[0xb].mutex = (void *)0x0;
      this_01[0xc].mutex = (void *)0x0;
      this_01[0xb].mutex = (void *)0x0;
      this_01[0xc].mutex = (void *)0x0;
      this_01[0xd].mutex = (void *)0x0;
      this_01[0xe].mutex = (void *)0x0;
      this_01[0x10].mutex = this_01;
      this_01[0x11].mutex = (void *)0x0;
      this_01[0x12].mutex = (void *)0x0;
      this_01[0x13].mutex = (void *)0x0;
      this_01[0x14].mutex = (void *)0x0;
      this_01[0x13].mutex = (void *)0x0;
      this_01[0x14].mutex = (void *)0x0;
      this_01[0x15].mutex = (void *)0x0;
      this_01[0x16].mutex = (void *)0x0;
      *local_100 = (long)this_01;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      auVar37 = (undefined1  [16])0x0;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      v1.field_0._0_8_ = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&v1);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&v1);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar11->alloc;
    uVar33 = (ulong)(((pBVar11->alloc).use_single_mode ^ 1) << 6);
    vgeomID.field_0.v[0] = 0xb0;
    pMVar12 = *(MutexSys **)((long)&this_01[8].mutex + uVar33);
    if (this_00 != (FastAllocator *)pMVar12[1].mutex) {
      v1.field_0._8_1_ = 1;
      v1.field_0._0_8_ = pMVar12;
      MutexSys::lock(pMVar12);
      if (pMVar12[1].mutex != (void *)0x0) {
        LOCK();
        plVar1 = (long *)((long)pMVar12[1].mutex + 0x118);
        *plVar1 = *plVar1 + (long)pMVar12[0x15].mutex + (long)pMVar12[0xd].mutex;
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar12[1].mutex + 0x120);
        *plVar1 = *plVar1 + (((long)pMVar12[0xb].mutex + (long)pMVar12[0x13].mutex) -
                            ((long)pMVar12[10].mutex + (long)pMVar12[0x12].mutex));
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar12[1].mutex + 0x128);
        *plVar1 = *plVar1 + (long)pMVar12[0x16].mutex + (long)pMVar12[0xe].mutex;
        UNLOCK();
      }
      pMVar12[0xb].mutex = (void *)0x0;
      pMVar12[0xc].mutex = (void *)0x0;
      pMVar12[0xd].mutex = (void *)0x0;
      pMVar12[0xe].mutex = (void *)0x0;
      pMVar12[9].mutex = (void *)0x0;
      pMVar12[10].mutex = (void *)0x0;
      pMVar12[0xb].mutex = (void *)0x0;
      pMVar12[0xc].mutex = (void *)0x0;
      pMVar12[0xc].mutex = (void *)(pBVar11->alloc).defaultBlockSize;
      pMVar12[0x11].mutex = (void *)0x0;
      pMVar12[0x12].mutex = (void *)0x0;
      pMVar12[0x13].mutex = (void *)0x0;
      pMVar12[0x14].mutex = (void *)0x0;
      pMVar12[0x13].mutex = (void *)0x0;
      pMVar12[0x14].mutex = (void *)0x0;
      pMVar12[0x15].mutex = (void *)0x0;
      pMVar12[0x16].mutex = (void *)0x0;
      pMVar12[0x14].mutex = (void *)(pBVar11->alloc).defaultBlockSize;
      LOCK();
      pMVar12[1].mutex = this_00;
      UNLOCK();
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      auVar37 = (undefined1  [16])0x0;
      v2.field_0._0_8_ = pMVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar11->alloc).thread_local_allocators,(value_type *)&v2);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
    }
    plVar1 = (long *)((long)&this_01[0xd].mutex + uVar33);
    *plVar1 = *plVar1 + vgeomID.field_0.v[0];
    lVar30 = *(long *)((long)&this_01[10].mutex + uVar33);
    uVar31 = (ulong)(-(int)lVar30 & 0xf);
    uVar28 = lVar30 + vgeomID.field_0.v[0] + uVar31;
    *(ulong *)((long)&this_01[10].mutex + uVar33) = uVar28;
    if (*(ulong *)((long)&this_01[0xb].mutex + uVar33) < uVar28) {
      *(long *)((long)&this_01[10].mutex + uVar33) = lVar30;
      pMVar12 = *(MutexSys **)((long)&this_01[0xc].mutex + uVar33);
      if (pMVar12 < (MutexSys *)(vgeomID.field_0.v[0] << 2)) {
        pauVar29 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&vgeomID);
      }
      else {
        lock.mutex = pMVar12;
        pauVar29 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined1 (**) [16])((long)&this_01[9].mutex + uVar33) = pauVar29;
        lVar30 = (*(long *)((long)&this_01[0xb].mutex + uVar33) -
                 *(long *)((long)&this_01[10].mutex + uVar33)) +
                 *(long *)((long)&this_01[0xe].mutex + uVar33);
        *(long *)((long)&this_01[0xe].mutex + uVar33) = lVar30;
        *(undefined8 *)((long)&this_01[10].mutex + uVar33) = 0;
        *(MutexSys **)((long)&this_01[0xb].mutex + uVar33) = lock.mutex;
        *(longlong *)((long)&this_01[10].mutex + uVar33) = vgeomID.field_0.v[0];
        if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
          *(undefined8 *)((long)&this_01[10].mutex + uVar33) = 0;
          lock.mutex = *(MutexSys **)((long)&this_01[0xc].mutex + uVar33);
          pauVar29 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined1 (**) [16])((long)&this_01[9].mutex + uVar33) = pauVar29;
          lVar30 = (*(long *)((long)&this_01[0xb].mutex + uVar33) -
                   *(long *)((long)&this_01[10].mutex + uVar33)) +
                   *(long *)((long)&this_01[0xe].mutex + uVar33);
          *(long *)((long)&this_01[0xe].mutex + uVar33) = lVar30;
          *(undefined8 *)((long)&this_01[10].mutex + uVar33) = 0;
          *(MutexSys **)((long)&this_01[0xb].mutex + uVar33) = lock.mutex;
          *(longlong *)((long)&this_01[10].mutex + uVar33) = vgeomID.field_0.v[0];
          if (lock.mutex < (ulong)vgeomID.field_0.v[0]) {
            *(undefined8 *)((long)&this_01[10].mutex + uVar33) = 0;
            pauVar29 = (undefined1 (*) [16])0x0;
            goto LAB_00d85e90;
          }
        }
        *(long *)((long)&this_01[0xe].mutex + uVar33) = lVar30;
      }
    }
    else {
      plVar1 = (long *)((long)&this_01[0xe].mutex + uVar33);
      *plVar1 = *plVar1 + uVar31;
      pauVar29 = (undefined1 (*) [16])
                 ((uVar28 - vgeomID.field_0._0_8_) + *(long *)((long)&this_01[9].mutex + uVar33));
    }
LAB_00d85e90:
    pSVar13 = topBuilder->bvh->scene;
    vgeomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar37,auVar37);
    uStack_148 = 0;
    uStack_140 = 0;
    lock.mutex = (MutexSys *)0x0;
    lock.locked = false;
    lock._9_7_ = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    v1.field_0._32_8_ = 0;
    v1.field_0._40_8_ = 0;
    v1.field_0._0_8_ = 0;
    v1.field_0._8_1_ = 0;
    v1.field_0._9_7_ = 0;
    v1.field_0._16_8_ = 0;
    v1.field_0._24_8_ = 0;
    v2.field_0._32_8_ = 0;
    v2.field_0._40_8_ = 0;
    v2.field_0._0_8_ = 0;
    v2.field_0._8_8_ = 0;
    v2.field_0._16_8_ = 0;
    v2.field_0._24_8_ = 0;
    pfVar32 = local_110[uVar36].upper.field_0.m128 + 3;
    vprimID.field_0 = vgeomID.field_0;
    for (uVar33 = 0; (uVar33 < 4 && (uVar36 + uVar33 < pinfo.end - pinfo.begin));
        uVar33 = uVar33 + 1) {
      fVar7 = pfVar32[-4];
      fVar8 = *pfVar32;
      pGVar10 = (pSVar13->geometries).items[(uint)fVar7].ptr;
      lVar34 = (ulong)(uint)fVar8 *
               pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar30 = *(long *)&pGVar10->field_0x58;
      lVar14 = *(long *)&pGVar10[1].time_range.upper;
      p_Var15 = pGVar10[1].intersectionFilterN;
      puVar3 = (undefined4 *)(lVar14 + (ulong)*(uint *)(lVar30 + lVar34) * (long)p_Var15);
      uVar9 = puVar3[1];
      uVar24 = puVar3[2];
      auVar37 = *(undefined1 (*) [16])
                 (lVar14 + (ulong)*(uint *)(lVar30 + 4 + lVar34) * (long)p_Var15);
      auVar5 = *(undefined1 (*) [16])
                (lVar14 + (ulong)*(uint *)(lVar30 + 8 + lVar34) * (long)p_Var15);
      *(undefined4 *)((long)&lock.mutex + uVar33 * 4) = *puVar3;
      *(undefined4 *)((long)&uStack_158 + uVar33 * 4) = uVar9;
      *(undefined4 *)((long)&uStack_148 + uVar33 * 4) = uVar24;
      *(int *)((long)&v1.field_0 + uVar33 * 4) = auVar37._0_4_;
      uVar9 = vextractps_avx(auVar37,1);
      *(undefined4 *)((long)&v1.field_0 + uVar33 * 4 + 0x10) = uVar9;
      uVar9 = vextractps_avx(auVar37,2);
      *(undefined4 *)((long)&v1.field_0 + uVar33 * 4 + 0x20) = uVar9;
      *(int *)((long)&v2.field_0 + uVar33 * 4) = auVar5._0_4_;
      uVar9 = vextractps_avx(auVar5,1);
      *(undefined4 *)((long)&v2.field_0 + uVar33 * 4 + 0x10) = uVar9;
      uVar9 = vextractps_avx(auVar5,2);
      *(undefined4 *)((long)&v2.field_0 + uVar33 * 4 + 0x20) = uVar9;
      vgeomID.field_0.i[uVar33] = (uint)fVar7;
      vprimID.field_0.i[uVar33] = (uint)fVar8;
      pfVar32 = pfVar32 + 8;
    }
    auVar37[8] = lock.locked;
    auVar37._0_8_ = lock.mutex;
    auVar37._9_7_ = lock._9_7_;
    auVar25._8_8_ = uStack_150;
    auVar25._0_8_ = uStack_158;
    auVar26._8_8_ = uStack_140;
    auVar26._0_8_ = uStack_148;
    auVar5[8] = v1.field_0._8_1_;
    auVar5._0_8_ = v1.field_0._0_8_;
    auVar5._9_7_ = v1.field_0._9_7_;
    auVar5 = vsubps_avx(auVar37,auVar5);
    auVar19._8_8_ = v1.field_0._24_8_;
    auVar19._0_8_ = v1.field_0._16_8_;
    auVar19 = vsubps_avx(auVar25,auVar19);
    auVar20._8_8_ = v1.field_0._40_8_;
    auVar20._0_8_ = v1.field_0._32_8_;
    auVar20 = vsubps_avx(auVar26,auVar20);
    auVar21._8_8_ = v2.field_0._8_8_;
    auVar21._0_8_ = v2.field_0._0_8_;
    auVar22._8_8_ = v2.field_0._24_8_;
    auVar22._0_8_ = v2.field_0._16_8_;
    auVar23._8_8_ = v2.field_0._40_8_;
    auVar23._0_8_ = v2.field_0._32_8_;
    auVar21 = vsubps_avx(auVar21,auVar37);
    auVar22 = vsubps_avx(auVar22,auVar25);
    auVar23 = vsubps_avx(auVar23,auVar26);
    auVar37 = vmovntps_avx(auVar37);
    *pauVar29 = auVar37;
    auVar37 = vmovntps_avx(auVar25);
    pauVar29[1] = auVar37;
    auVar37 = vmovntps_avx(auVar26);
    pauVar29[2] = auVar37;
    auVar37 = vmovntps_avx(auVar5);
    pauVar29[3] = auVar37;
    auVar37 = vmovntps_avx(auVar19);
    pauVar29[4] = auVar37;
    auVar37 = vmovntps_avx(auVar20);
    pauVar29[5] = auVar37;
    auVar37 = vmovntps_avx(auVar21);
    pauVar29[6] = auVar37;
    auVar37 = vmovntps_avx(auVar22);
    pauVar29[7] = auVar37;
    auVar37 = vmovntps_avx(auVar23);
    pauVar29[8] = auVar37;
    auVar37 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
    pauVar29[9] = auVar37;
    auVar37 = vmovntps_avx((undefined1  [16])vprimID.field_0);
    pauVar29[10] = auVar37;
    aVar17 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                           field_0,ZEXT416((uint)local_108->objectID_),0x30);
    auVar38 = ZEXT1664((undefined1  [16])aVar17);
    LOCK();
    paVar2 = &topBuilder->nextRef;
    iVar4 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    aVar18 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                           field_0,ZEXT416(1),0x30);
    pBVar16 = (topBuilder->refs).items;
    pBVar16[iVar4].super_PrimRef.upper.field_0 = aVar18;
    pBVar16[iVar4].super_PrimRef.lower.field_0 = aVar17;
    pBVar16[iVar4].node.ptr = (ulong)pauVar29 | 9;
    pBVar16[iVar4].bounds_area = 0.0;
    uVar36 = uVar36 + uVar33;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }